

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::makeSolvable(MLMG *this,int amrlev,int mglev,Any *mf)

{
  Long LVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  int *in_RDI;
  int c;
  int ncomp;
  Vector<double,_std::allocator<double>_> *offset;
  Print *in_stack_fffffffffffffdd8;
  Print *in_stack_fffffffffffffde0;
  Print *in_stack_fffffffffffffe08;
  Print *in_stack_fffffffffffffe10;
  Print *in_stack_fffffffffffffe50;
  int local_40;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined8 local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  (**(code **)(**(long **)(in_RDI + 0x12) + 0xd8))
            (local_38,*(long **)(in_RDI + 0x12),in_ESI,in_EDX,in_RCX);
  local_20 = local_38;
  if (3 < *in_RDI) {
    LVar1 = Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0x1259d68);
    for (local_40 = 0; local_40 < (int)LVar1; local_40 = local_40 + 1) {
      OutStream();
      Print::Print(in_stack_fffffffffffffe10,(ostream *)in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe10 =
           Print::operator<<(in_stack_fffffffffffffde0,(char (*) [19])in_stack_fffffffffffffdd8);
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0,
                 (size_type)in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffe08 =
           Print::operator<<(in_stack_fffffffffffffde0,(double *)in_stack_fffffffffffffdd8);
      Print::operator<<(in_stack_fffffffffffffde0,(char (*) [24])in_stack_fffffffffffffdd8);
      Print::operator<<(in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->rank);
      Print::operator<<(in_stack_fffffffffffffde0,(char (*) [12])in_stack_fffffffffffffdd8);
      Print::operator<<(in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->rank);
      in_stack_fffffffffffffde0 =
           Print::operator<<(in_stack_fffffffffffffde0,(char (*) [3])in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffdd8 =
           Print::operator<<(in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->rank);
      Print::operator<<(in_stack_fffffffffffffde0,(char (*) [3])in_stack_fffffffffffffdd8);
      Print::~Print(in_stack_fffffffffffffe50);
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x12) + 0xe0))
            (*(long **)(in_RDI + 0x12),local_c,local_10,local_18,local_20);
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x1259f1e);
  return;
}

Assistant:

void
MLMG::makeSolvable (int amrlev, int mglev, Any& mf)
{
    auto const& offset = linop.getSolvabilityOffset(amrlev, mglev, mf);
    if (verbose >= 4) {
        const int ncomp = offset.size();
        for (int c = 0; c < ncomp; ++c) {
            amrex::Print() << "MLMG: Subtracting " << offset[c]
                           << " from mf component c = " << c
                           << " on level (" << amrlev << ", " << mglev << ")\n";
        }
    }
    linop.fixSolvabilityByOffset(amrlev, mglev, mf, offset);
}